

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi_test.c
# Opt level: O0

void run_test(char *filename,uint lineno,bidi_char *bcs,size_t bcs_len,uint *order,size_t order_len,
             int override)

{
  bool bVar1;
  byte bVar2;
  _Bool _Var3;
  void *__dest;
  size_t factor1;
  void *ptr;
  char *local_98;
  ulong local_90;
  size_t i_5;
  size_t i_4;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  _Bool ok;
  ulong uStack_60;
  BidiType t;
  size_t i;
  size_t our_order_len;
  uint *our_order;
  bidi_char *bcs_orig;
  size_t bcs_orig_len;
  size_t order_len_local;
  uint *order_local;
  size_t bcs_len_local;
  bidi_char *bcs_local;
  uint lineno_local;
  char *filename_local;
  
  __dest = safemalloc(bcs_len,0xc,0);
  if (bcs_len != 0) {
    memcpy(__dest,bcs,bcs_len * 0xc);
  }
  factor1 = do_bidi_test(ctx,bcs,bcs_len,override);
  ptr = safemalloc(factor1,4,0);
  i = 0;
  for (uStack_60 = 0; uStack_60 < factor1; uStack_60 = uStack_60 + 1) {
    bVar2 = bidi_getType(bcs[uStack_60].wc);
    _Var3 = typeIsRemovedDuringProcessing((uint)bVar2);
    if (!_Var3) {
      *(uint *)((long)ptr + i * 4) = (uint)bcs[uStack_60].index;
      i = i + 1;
    }
  }
  bVar1 = false;
  if (i == order_len) {
    bVar1 = true;
    for (i_2 = 0; i_2 < i; i_2 = i_2 + 1) {
      if (*(uint *)((long)ptr + i_2 * 4) != order[i_2]) {
        bVar1 = false;
      }
    }
  }
  if (bVar1) {
    pass = pass + 1;
  }
  else {
    fail = fail + 1;
    printf("%s:%u: failed order\n",filename,(ulong)lineno);
    printf("  input chars:");
    for (i_3 = 0; i_3 < bcs_len; i_3 = i_3 + 1) {
      printf(" %04x",(ulong)*(uint *)((long)__dest + i_3 * 0xc + 4));
    }
    printf("\n");
    printf("  classes:    ");
    for (i_4 = 0; i_4 < bcs_len; i_4 = i_4 + 1) {
      bVar2 = bidi_getType(*(wchar_t *)((long)__dest + i_4 * 0xc + 4));
      printf(" %-4s",typenames[bVar2]);
    }
    printf("\n");
    if (override < 1) {
      local_98 = "auto";
      if (override < 0) {
        local_98 = "RTL";
      }
    }
    else {
      local_98 = "LTR";
    }
    printf("  para level = %s\n",local_98);
    printf("  expected:");
    for (i_5 = 0; i_5 < order_len; i_5 = i_5 + 1) {
      printf(" %u",(ulong)order[i_5]);
    }
    printf("\n");
    printf("  got:     ");
    for (local_90 = 0; local_90 < i; local_90 = local_90 + 1) {
      printf(" %u",(ulong)*(uint *)((long)ptr + local_90 * 4));
    }
    printf("\n");
  }
  memcpy(bcs,__dest,bcs_len * 0xc);
  safefree(__dest);
  safefree(ptr);
  return;
}

Assistant:

static void run_test(const char *filename, unsigned lineno,
                     bidi_char *bcs, size_t bcs_len,
                     const unsigned *order, size_t order_len,
                     int override)
{
    size_t bcs_orig_len = bcs_len;
    bidi_char *bcs_orig = snewn(bcs_orig_len, bidi_char);
    if (bcs_orig_len)
        memcpy(bcs_orig, bcs, bcs_orig_len * sizeof(bidi_char));

    bcs_len = do_bidi_test(ctx, bcs, bcs_len, override);

    /*
     * TR9 revision 44 rule X9 says we remove explicit embedding
     * controls and BN characters. So the test cases don't list them
     * in the expected outputs. Do the same to our own output - unless
     * we're testing the standard version of the algorithm, in which
     * case, we expect the output to be exactly as the test cases say.
     */
    unsigned *our_order = snewn(bcs_len, unsigned);
    size_t our_order_len = 0;
    for (size_t i = 0; i < bcs_len; i++) {
        BidiType t = bidi_getType(bcs[i].wc);
#ifndef REMOVE_FORMATTING_CHARS
        if (typeIsRemovedDuringProcessing(t))
            continue;
#endif
        our_order[our_order_len++] = bcs[i].index;
    }

    bool ok = false;
    if (our_order_len == order_len) {
        ok = true;
        for (size_t i = 0; i < our_order_len; i++)
            if (our_order[i] != order[i])
                ok = false;
    }
    if (ok) {
        pass++;
    } else {
        fail++;
        printf("%s:%u: failed order\n", filename, lineno);
        printf("  input chars:");
        for (size_t i = 0; i < bcs_orig_len; i++)
            printf(" %04x", bcs_orig[i].wc);
        printf("\n");
        printf("  classes:    ");
        for (size_t i = 0; i < bcs_orig_len; i++)
            printf(" %-4s", typenames[bidi_getType(bcs_orig[i].wc)]);
        printf("\n");
        printf("  para level = %s\n",
               override > 0 ? "LTR" : override < 0 ? "RTL" : "auto");
        printf("  expected:");
        for (size_t i = 0; i < order_len; i++)
            printf(" %u", order[i]);
        printf("\n");
        printf("  got:     ");
        for (size_t i = 0; i < our_order_len; i++)
            printf(" %u", our_order[i]);
        printf("\n");
    }

    /* Put the original data back so we can re-test with another override */
    memcpy(bcs, bcs_orig, bcs_orig_len * sizeof(bidi_char));

    sfree(bcs_orig);
    sfree(our_order);
}